

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

Option * __thiscall
kj::MainBuilder::Impl::addOption
          (Impl *this,initializer_list<kj::MainBuilder::OptionName> names,bool hasArg,
          StringPtr helpText)

{
  OptionName *pOVar1;
  OptionName *pOVar2;
  Exception *__s;
  anon_union_8_2_b8f7b3a3_for_OptionName_1 aVar3;
  undefined7 uVar4;
  Option *pOVar5;
  size_t size;
  anon_union_8_2_b8f7b3a3_for_OptionName_1 *params_1;
  long lVar6;
  ulong uVar7;
  ArrayPtr<kj::MainBuilder::OptionName> AVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>,_bool>
  pVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>,_bool> pVar10
  ;
  Fault f;
  
  size = names._M_len;
  if (size == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
               ,0x12e,FAILED,"names.size() > 0","\"option must have at least one name\"",
               (char (*) [35])"option must have at least one name");
    _::Debug::Fault::fatal(&f);
  }
  pOVar5 = Arena::allocate<kj::MainBuilder::Impl::Option>(&this->arena);
  AVar8 = Arena::allocateArray<kj::MainBuilder::OptionName>(&this->arena,size);
  pOVar5->names = AVar8;
  params_1 = &(names._M_array)->field_1;
  lVar6 = size << 4;
  uVar7 = 0;
  do {
    if (lVar6 == 0) {
      pOVar5->hasArg = hasArg;
      (pOVar5->helpText).content.ptr = helpText.content.ptr;
      (pOVar5->helpText).content.size_ = helpText.content.size_;
      return pOVar5;
    }
    pOVar1 = (OptionName *)(params_1 + -1);
    uVar4 = *(undefined7 *)&pOVar1->field_0x1;
    aVar3.longName = *(char **)params_1;
    pOVar2 = (pOVar5->names).ptr + uVar7;
    pOVar2->isLong = pOVar1->isLong;
    *(undefined7 *)&pOVar2->field_0x1 = uVar4;
    (pOVar2->field_1).longName = (char *)aVar3;
    if (pOVar1->isLong == true) {
      __s = (Exception *)params_1->longName;
      strlen((char *)__s);
      f.exception = __s;
      pVar9 = ::std::
              _Rb_tree<kj::ArrayPtr<char_const>,std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>,std::_Select1st<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>,kj::MainBuilder::Impl::CharArrayCompare,std::allocator<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>>
              ::
              _M_emplace_unique<std::pair<kj::ArrayPtr<char_const>,kj::MainBuilder::Impl::Option*>>
                        ((_Rb_tree<kj::ArrayPtr<char_const>,std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>,std::_Select1st<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>,kj::MainBuilder::Impl::CharArrayCompare,std::allocator<std::pair<kj::ArrayPtr<char_const>const,kj::MainBuilder::Impl::Option*>>>
                          *)&this->longOptions,
                         (pair<kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*> *)&f);
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[17],char_const*const&>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
                   ,0x138,FAILED,
                   "longOptions.insert(std::make_pair(StringPtr(name.longName).asArray(), &option)).second"
                   ,"\"duplicate option\", name.longName",(char (*) [17])"duplicate option",
                   &params_1->longName);
        _::Debug::Fault::fatal(&f);
      }
    }
    else {
      f.exception._0_1_ = params_1->shortName;
      pVar10 = ::std::
               _Rb_tree<char,std::pair<char_const,kj::MainBuilder::Impl::Option*>,std::_Select1st<std::pair<char_const,kj::MainBuilder::Impl::Option*>>,std::less<char>,std::allocator<std::pair<char_const,kj::MainBuilder::Impl::Option*>>>
               ::_M_emplace_unique<std::pair<char,kj::MainBuilder::Impl::Option*>>
                         ((_Rb_tree<char,std::pair<char_const,kj::MainBuilder::Impl::Option*>,std::_Select1st<std::pair<char_const,kj::MainBuilder::Impl::Option*>>,std::less<char>,std::allocator<std::pair<char_const,kj::MainBuilder::Impl::Option*>>>
                           *)&this->shortOptions,(pair<char,_kj::MainBuilder::Impl::Option_*> *)&f);
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[17],char_const&>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
                   ,0x13c,FAILED,
                   "shortOptions.insert(std::make_pair(name.shortName, &option)).second",
                   "\"duplicate option\", name.shortName",(char (*) [17])"duplicate option",
                   &params_1->shortName);
        _::Debug::Fault::fatal(&f);
      }
    }
    params_1 = params_1 + 2;
    lVar6 = lVar6 + -0x10;
    uVar7 = (ulong)((int)uVar7 + 1);
  } while( true );
}

Assistant:

Option& addOption(std::initializer_list<OptionName> names, bool hasArg, StringPtr helpText) {
    KJ_REQUIRE(names.size() > 0, "option must have at least one name");

    Option& option = arena.allocate<Option>();
    option.names = arena.allocateArray<OptionName>(names.size());
    uint i = 0;
    for (auto& name: names) {
      option.names[i++] = name;
      if (name.isLong) {
        KJ_REQUIRE(
            longOptions.insert(std::make_pair(StringPtr(name.longName).asArray(), &option)).second,
            "duplicate option", name.longName);
      } else {
        KJ_REQUIRE(
            shortOptions.insert(std::make_pair(name.shortName, &option)).second,
            "duplicate option", name.shortName);
      }
    }
    option.hasArg = hasArg;
    option.helpText = helpText;
    return option;
  }